

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_eh.h
# Opt level: O0

uint64_t resolve_indirect_value(_Unwind_Context *c,uchar encoding,int64_t v,dw_eh_ptr_t start)

{
  dwarf_data_relative dVar1;
  int iVar2;
  long lVar3;
  dw_eh_ptr_t start_local;
  int64_t v_local;
  uchar encoding_local;
  _Unwind_Context *c_local;
  
  dVar1 = get_base(encoding);
  if (dVar1 == DW_EH_PE_pcrel) {
    start_local = start + v;
  }
  else if (dVar1 == DW_EH_PE_textrel) {
    lVar3 = _Unwind_GetTextRelBase(c);
    start_local = (dw_eh_ptr_t)(lVar3 + v);
  }
  else if (dVar1 == DW_EH_PE_datarel) {
    lVar3 = _Unwind_GetDataRelBase(c);
    start_local = (dw_eh_ptr_t)(lVar3 + v);
  }
  else {
    start_local = (dw_eh_ptr_t)v;
    if (dVar1 == DW_EH_PE_funcrel) {
      lVar3 = _Unwind_GetRegionStart(c);
      start_local = (dw_eh_ptr_t)(lVar3 + v);
    }
  }
  iVar2 = is_indirect(encoding);
  if (iVar2 != 0) {
    start_local = *(dw_eh_ptr_t *)start_local;
  }
  return (uint64_t)start_local;
}

Assistant:

static uint64_t resolve_indirect_value(struct _Unwind_Context *c, unsigned char encoding, int64_t v, dw_eh_ptr_t start)
{
	switch (get_base(encoding))
	{
		case DW_EH_PE_pcrel:
			v += (uint64_t)(uintptr_t)start;
			break;
		case DW_EH_PE_textrel:
			v += (uint64_t)(uintptr_t)_Unwind_GetTextRelBase(c);
			break;
		case DW_EH_PE_datarel:
			v += (uint64_t)(uintptr_t)_Unwind_GetDataRelBase(c);
			break;
		case DW_EH_PE_funcrel:
			v += (uint64_t)(uintptr_t)_Unwind_GetRegionStart(c);
		default:
			break;
	}
	// If this is an indirect value, then it is really the address of the real
	// value
	// TODO: Check whether this should really always be a pointer - it seems to
	// be a GCC extensions, so not properly documented...
	if (is_indirect(encoding))
	{
		v = (uint64_t)(uintptr_t)*(void**)(uintptr_t)v;
	}
	return v;
}